

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

ChunkVectorInfo * __thiscall
duckdb::RowVersionManager::GetVectorInfo(RowVersionManager *this,idx_t vector_idx)

{
  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
  *this_00;
  transaction_t tVar1;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var2;
  reference pvVar3;
  pointer pCVar4;
  ChunkConstantInfo *pCVar5;
  pointer pCVar6;
  ChunkVectorInfo *pCVar7;
  idx_t i;
  long lVar8;
  _Head_base<0UL,_duckdb::ChunkVectorInfo_*,_false> _Var9;
  _Head_base<0UL,_duckdb::ChunkVectorInfo_*,_false> local_40;
  unsigned_long local_38;
  
  FillVectorInfo(this,vector_idx);
  this_00 = &this->vector_info;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
           ::get<true>(this_00,vector_idx);
  if ((pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
      super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
      super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl == (ChunkInfo *)0x0) {
    local_38 = vector_idx * 0x800 + this->start;
    make_uniq<duckdb::ChunkVectorInfo,unsigned_long>((duckdb *)&local_40,&local_38);
    _Var9._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (ChunkVectorInfo *)0x0;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::get<true>(this_00,vector_idx);
  }
  else {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::get<true>(this_00,vector_idx);
    pCVar4 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator->
                       (pvVar3);
    if (pCVar4->type != CONSTANT_INFO) goto LAB_01aa1bc2;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::get<true>(this_00,vector_idx);
    pCVar4 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator->
                       (pvVar3);
    pCVar5 = ChunkInfo::Cast<duckdb::ChunkConstantInfo>(pCVar4);
    local_38 = vector_idx * 0x800 + this->start;
    make_uniq<duckdb::ChunkVectorInfo,unsigned_long>((duckdb *)&local_40,&local_38);
    tVar1 = pCVar5->insert_id;
    pCVar6 = unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
             ::operator->((unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
                           *)&local_40);
    pCVar6->insert_id = tVar1;
    for (lVar8 = 0; _Var9._M_head_impl = local_40._M_head_impl, lVar8 != 0x800; lVar8 = lVar8 + 1) {
      tVar1 = pCVar5->insert_id;
      pCVar6 = unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
               ::operator->((unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
                             *)&local_40);
      pCVar6->inserted[lVar8] = tVar1;
    }
    local_40._M_head_impl = (ChunkVectorInfo *)0x0;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::get<true>(this_00,vector_idx);
  }
  _Var2._M_head_impl =
       (pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
       super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
  (pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
  super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl =
       &(_Var9._M_head_impl)->super_ChunkInfo;
  if (_Var2._M_head_impl != (ChunkInfo *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ChunkInfo + 8))();
  }
  if (local_40._M_head_impl != (ChunkVectorInfo *)0x0) {
    (*((local_40._M_head_impl)->super_ChunkInfo)._vptr_ChunkInfo[1])();
  }
LAB_01aa1bc2:
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
           ::get<true>(this_00,vector_idx);
  pCVar4 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator->
                     (pvVar3);
  pCVar7 = ChunkInfo::Cast<duckdb::ChunkVectorInfo>(pCVar4);
  return pCVar7;
}

Assistant:

ChunkVectorInfo &RowVersionManager::GetVectorInfo(idx_t vector_idx) {
	FillVectorInfo(vector_idx);

	if (!vector_info[vector_idx]) {
		// no info yet: create it
		vector_info[vector_idx] = make_uniq<ChunkVectorInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
	} else if (vector_info[vector_idx]->type == ChunkInfoType::CONSTANT_INFO) {
		auto &constant = vector_info[vector_idx]->Cast<ChunkConstantInfo>();
		// info exists but it's a constant info: convert to a vector info
		auto new_info = make_uniq<ChunkVectorInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
		new_info->insert_id = constant.insert_id;
		for (idx_t i = 0; i < STANDARD_VECTOR_SIZE; i++) {
			new_info->inserted[i] = constant.insert_id;
		}
		vector_info[vector_idx] = std::move(new_info);
	}
	D_ASSERT(vector_info[vector_idx]->type == ChunkInfoType::VECTOR_INFO);
	return vector_info[vector_idx]->Cast<ChunkVectorInfo>();
}